

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
Matrix<double>::get(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
                   Matrix<double> *this,uint row)

{
  if (row < (this->m_shape).n_row) {
    std::vector<double,_std::allocator<double>_>::vector
              (__return_storage_ptr__,
               (this->m_elems).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + row);
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [get]: Row limit exceeded!\n");
  exit(1);
}

Assistant:

std::vector<T> Matrix<T>::get(unsigned row) const{
    if(row>=m_shape.n_row){
        std::cout<<"ERROR [get]: Row limit exceeded!\n";
        exit(1);
    }
    return m_elems[row];
}